

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev3dev.cpp
# Opt level: O0

void __thiscall ev3dev::remote_control::on_value_changed(remote_control *this,int value)

{
  bool bVar1;
  undefined4 in_ESI;
  function<void_(bool)> *in_RDI;
  int new_state;
  int in_stack_ffffffffffffffdc;
  uint local_10;
  
  local_10 = 0;
  switch(in_ESI) {
  case 1:
    local_10 = 1;
    break;
  case 2:
    local_10 = 2;
    break;
  case 3:
    local_10 = 4;
    break;
  case 4:
    local_10 = 8;
    break;
  case 5:
    local_10 = 5;
    break;
  case 6:
    local_10 = 9;
    break;
  case 7:
    local_10 = 6;
    break;
  case 8:
    local_10 = 10;
    break;
  case 9:
    local_10 = 0x10;
    break;
  case 10:
    local_10 = 3;
    break;
  case 0xb:
    local_10 = 0xc;
  }
  if (((local_10 & 1) != (*(uint *)((long)&in_RDI[6]._M_invoker + 4) & 1)) &&
     (bVar1 = std::function::operator_cast_to_bool(in_RDI), bVar1)) {
    std::function<void_(bool)>::operator()(in_RDI,SUB41((uint)in_stack_ffffffffffffffdc >> 0x18,0));
  }
  if (((local_10 & 2) != (*(uint *)((long)&in_RDI[6]._M_invoker + 4) & 2)) &&
     (bVar1 = std::function::operator_cast_to_bool(in_RDI), bVar1)) {
    std::function<void_(bool)>::operator()(in_RDI,SUB41((uint)in_stack_ffffffffffffffdc >> 0x18,0));
  }
  if (((local_10 & 4) != (*(uint *)((long)&in_RDI[6]._M_invoker + 4) & 4)) &&
     (bVar1 = std::function::operator_cast_to_bool(in_RDI), bVar1)) {
    std::function<void_(bool)>::operator()(in_RDI,SUB41((uint)in_stack_ffffffffffffffdc >> 0x18,0));
  }
  if (((local_10 & 8) != (*(uint *)((long)&in_RDI[6]._M_invoker + 4) & 8)) &&
     (bVar1 = std::function::operator_cast_to_bool(in_RDI), bVar1)) {
    std::function<void_(bool)>::operator()(in_RDI,SUB41((uint)in_stack_ffffffffffffffdc >> 0x18,0));
  }
  if (((local_10 & 0x10) != (*(uint *)((long)&in_RDI[6]._M_invoker + 4) & 0x10)) &&
     (bVar1 = std::function::operator_cast_to_bool(in_RDI), bVar1)) {
    std::function<void_(bool)>::operator()(in_RDI,SUB41((uint)in_stack_ffffffffffffffdc >> 0x18,0));
  }
  if ((local_10 != *(uint *)((long)&in_RDI[6]._M_invoker + 4)) &&
     (bVar1 = std::function::operator_cast_to_bool((function<void_(int)> *)0x13ac24), bVar1)) {
    std::function<void_(int)>::operator()((function<void_(int)> *)in_RDI,in_stack_ffffffffffffffdc);
  }
  *(uint *)((long)&in_RDI[6]._M_invoker + 4) = local_10;
  return;
}

Assistant:

void remote_control::on_value_changed(int value) {
    int new_state = 0;

    switch (value) {
        case 1:
            new_state = red_up;
            break;
        case 2:
            new_state = red_down;
            break;
        case 3:
            new_state = blue_up;
            break;
        case  4:
            new_state = blue_down;
            break;
        case 5:
            new_state = red_up | blue_up;
            break;
        case 6:
            new_state = red_up | blue_down;
            break;
        case 7:
            new_state = red_down |  blue_up;
            break;
        case 8:
            new_state = red_down | blue_down;
            break;
        case 9:
            new_state = beacon;
            break;
        case 10:
            new_state = red_up | red_down;
            break;
        case 11:
            new_state = blue_up | blue_down;
            break;
    }

    if (((new_state & red_up) != (_state & red_up)) &&
            static_cast<bool>(on_red_up))
        on_red_up(new_state & red_up);

    if (((new_state & red_down) != (_state & red_down)) &&
            static_cast<bool>(on_red_down))
        on_red_down(new_state & red_down);

    if (((new_state & blue_up) != (_state & blue_up)) &&
            static_cast<bool>(on_blue_up))
        on_blue_up(new_state & blue_up);

    if (((new_state & blue_down) != (_state & blue_down)) &&
            static_cast<bool>(on_blue_down))
        on_blue_down(new_state & blue_down);

    if (((new_state & beacon) != (_state & beacon)) &&
            static_cast<bool>(on_beacon))
        on_beacon(new_state & beacon);

    if ((new_state != _state) &&
            static_cast<bool>(on_state_change))
        on_state_change(new_state);

    _state = new_state;
}